

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

int __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::removeMin(Heap<Gluco::Solver::VarOrderLt> *this)

{
  int index;
  int iVar1;
  int *piVar2;
  int x;
  Heap<Gluco::Solver::VarOrderLt> *this_local;
  
  piVar2 = vec<int>::operator[](&this->heap,0);
  index = *piVar2;
  piVar2 = vec<int>::last(&this->heap);
  iVar1 = *piVar2;
  piVar2 = vec<int>::operator[](&this->heap,0);
  *piVar2 = iVar1;
  piVar2 = vec<int>::operator[](&this->heap,0);
  piVar2 = vec<int>::operator[](&this->indices,*piVar2);
  *piVar2 = 0;
  piVar2 = vec<int>::operator[](&this->indices,index);
  *piVar2 = -1;
  vec<int>::pop(&this->heap);
  iVar1 = vec<int>::size(&this->heap);
  if (1 < iVar1) {
    percolateDown(this,0);
  }
  return index;
}

Assistant:

int  removeMin()
    {
        int x            = heap[0];
        heap[0]          = heap.last();
        indices[heap[0]] = 0;
        indices[x]       = -1;
        heap.pop();
        if (heap.size() > 1) percolateDown(0);
        return x; 
    }